

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test_cases.cpp
# Opt level: O0

string * (anonymous_namespace)::get_name_abi_cxx11_(pbf_reader layer)

{
  bool bVar1;
  string *in_RDI;
  allocator local_9d [19];
  Decomposer local_8a;
  ExprLhs<bool> local_89;
  StringRef local_88;
  SourceLineInfo local_78;
  StringRef local_68;
  undefined1 local_58 [8];
  AssertionHandler catchAssertionHandler;
  
  bVar1 = protozero::pbf_reader::next((pbf_reader *)&stack0x00000008,1);
  if (bVar1) {
    protozero::pbf_reader::get_string_abi_cxx11_(in_RDI,(pbf_reader *)&stack0x00000008);
  }
  else {
    local_68 = operator____catch_sr("REQUIRE",7);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/test/t/vector_tile/reader_test_cases.cpp"
               ,0x10);
    Catch::StringRef::StringRef(&local_88,"false");
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_58,&local_68,&local_78,local_88,Normal);
    local_89 = Catch::Decomposer::operator<=(&local_8a,false);
    Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_58,&local_89);
    Catch::AssertionHandler::complete((AssertionHandler *)local_58);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",local_9d);
    std::allocator<char>::~allocator((allocator<char> *)local_9d);
  }
  return in_RDI;
}

Assistant:

std::string get_name(protozero::pbf_reader layer) { // copy!
    while (layer.next(1)) { // required string name
        return layer.get_string();
    }
    REQUIRE(false); // should never be here
    return "";
}